

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O2

region * visible_region_at(level *lev,xchar x,xchar y)

{
  int iVar1;
  region *reg;
  boolean bVar2;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  long lVar3;
  
  iVar1 = lev->n_regions;
  lVar3 = 0;
  while( true ) {
    if (iVar1 <= lVar3) {
      return (region *)0x0;
    }
    reg = lev->regions[lVar3];
    bVar2 = inside_region(reg,(int)CONCAT71(in_register_00000031,x),
                          (int)CONCAT71(in_register_00000011,y));
    if (((bVar2 != '\0') && (reg->visible != '\0')) && (reg->ttl != 0)) break;
    lVar3 = lVar3 + 1;
  }
  return reg;
}

Assistant:

struct region *visible_region_at(struct level *lev, xchar x, xchar y)
{
    int i;

    for (i = 0; i < lev->n_regions; i++)
	if (inside_region(lev->regions[i], x, y) && lev->regions[i]->visible &&
		lev->regions[i]->ttl != 0)
	    return lev->regions[i];
    return NULL;
}